

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_extra_items_parse
                   (FT_Byte **pp,FT_Byte *limit,PFR_ExtraItem item_list,FT_Pointer item_data)

{
  uint uVar1;
  byte *pbVar2;
  PFR_ExtraItem local_50;
  PFR_ExtraItem extra;
  FT_UInt item_size;
  FT_UInt item_type;
  FT_UInt num_items;
  FT_Byte *p;
  FT_Error error;
  FT_Pointer item_data_local;
  PFR_ExtraItem item_list_local;
  FT_Byte *limit_local;
  FT_Byte **pp_local;
  
  p._4_4_ = 0;
  pbVar2 = *pp;
  _item_type = pbVar2;
  if (limit < pbVar2 + 1) {
LAB_001695d2:
    p._4_4_ = 8;
  }
  else {
    _item_type = pbVar2 + 1;
    for (item_size = (FT_UInt)*pbVar2; item_size != 0; item_size = item_size - 1) {
      if (limit < _item_type + 2) goto LAB_001695d2;
      pbVar2 = _item_type + 1;
      uVar1 = (uint)*_item_type;
      _item_type = _item_type + 2;
      if (limit < _item_type + uVar1) goto LAB_001695d2;
      local_50 = item_list;
      if (item_list != (PFR_ExtraItem)0x0) {
        for (; local_50->parser != (PFR_ExtraItem_ParseFunc)0x0; local_50 = local_50 + 1) {
          if (local_50->type == (uint)*pbVar2) {
            p._4_4_ = (*local_50->parser)(_item_type,_item_type + uVar1,item_data);
            if (p._4_4_ != 0) goto LAB_001695be;
            break;
          }
        }
      }
      _item_type = _item_type + uVar1;
    }
  }
LAB_001695be:
  *pp = _item_type;
  return p._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_extra_items_parse( FT_Byte*       *pp,
                         FT_Byte*        limit,
                         PFR_ExtraItem   item_list,
                         FT_Pointer      item_data )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  p     = *pp;
    FT_UInt   num_items, item_type, item_size;


    PFR_CHECK( 1 );
    num_items = PFR_NEXT_BYTE( p );

    for ( ; num_items > 0; num_items-- )
    {
      PFR_CHECK( 2 );
      item_size = PFR_NEXT_BYTE( p );
      item_type = PFR_NEXT_BYTE( p );

      PFR_CHECK( item_size );

      if ( item_list )
      {
        PFR_ExtraItem  extra = item_list;


        for ( extra = item_list; extra->parser != NULL; extra++ )
        {
          if ( extra->type == item_type )
          {
            error = extra->parser( p, p + item_size, item_data );
            if ( error )
              goto Exit;

            break;
          }
        }
      }

      p += item_size;
    }

  Exit:
    *pp = p;
    return error;

  Too_Short:
    FT_ERROR(( "pfr_extra_items_parse: invalid extra items table\n" ));
    error = FT_THROW( Invalid_Table );
    goto Exit;
  }